

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_function.hpp
# Opt level: O0

unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>,_true>
duckdb::MultiFileFunction<duckdb::ParquetMultiFileInfo>::MultiFileFilterPushdown
          (ClientContext *context,MultiFileBindData *data,vector<unsigned_long,_true> *column_ids,
          optional_ptr<duckdb::TableFilterSet,_true> filters)

{
  bool bVar1;
  pointer pMVar2;
  type pMVar3;
  TableFilterSet *pTVar4;
  undefined8 in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_> in_RDI;
  unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>,_true> *new_list;
  nullptr_t in_stack_ffffffffffffff68;
  shared_ptr<duckdb::MultiFileList,_true> *in_stack_ffffffffffffff70;
  optional_ptr local_18 [16];
  
  bVar1 = duckdb::optional_ptr::operator_cast_to_bool(local_18);
  if (bVar1) {
    pMVar2 = unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
             ::operator->((unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
                           *)in_stack_ffffffffffffff70);
    pMVar3 = shared_ptr<duckdb::MultiFileList,_true>::operator*(in_stack_ffffffffffffff70);
    pTVar4 = optional_ptr<duckdb::TableFilterSet,_true>::operator*
                       ((optional_ptr<duckdb::TableFilterSet,_true> *)in_stack_ffffffffffffff70);
    (**(code **)(*(long *)pMVar2 + 0x30))
              (in_RDI._M_t.
               super___uniq_ptr_impl<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::MultiFileList_*,_std::default_delete<duckdb::MultiFileList>_>
               .super__Head_base<0UL,_duckdb::MultiFileList_*,_false>._M_head_impl,pMVar2,in_RSI,
               pMVar3,in_RDX + 0x98,in_RDX + 0x148,in_RDX + 0x130,in_RCX,pTVar4);
  }
  else {
    unique_ptr<duckdb::MultiFileList,std::default_delete<duckdb::MultiFileList>,true>::
    unique_ptr<std::default_delete<duckdb::MultiFileList>,void>
              ((unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>,_true>
                *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  return (unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_>)
         (__uniq_ptr_impl<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::MultiFileList_*,_std::default_delete<duckdb::MultiFileList>_>
         .super__Head_base<0UL,_duckdb::MultiFileList_*,_false>._M_head_impl;
}

Assistant:

static unique_ptr<MultiFileList> MultiFileFilterPushdown(ClientContext &context, const MultiFileBindData &data,
	                                                         const vector<column_t> &column_ids,
	                                                         optional_ptr<TableFilterSet> filters) {
		if (!filters) {
			return nullptr;
		}
		auto new_list = data.multi_file_reader->DynamicFilterPushdown(context, *data.file_list, data.file_options,
		                                                              data.names, data.types, column_ids, *filters);
		return new_list;
	}